

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp.cc
# Opt level: O3

RunResult __thiscall
wabt::interp::Thread::
DoSimdExtmul<wabt::interp::Simd<int,(unsigned_char)4>,wabt::interp::Simd<short,(unsigned_char)8>,true>
          (Thread *this)

{
  undefined1 auVar1 [14];
  undefined1 auVar2 [14];
  undefined1 auVar3 [14];
  ulong uVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  Value VVar10;
  Value VVar11;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  
  VVar10 = Pop(this);
  uVar4 = VVar10.field_0.i64_;
  VVar11 = Pop(this);
  auVar9._8_4_ = 0;
  auVar9._0_8_ = uVar4;
  auVar9._12_2_ = VVar10.field_0._6_2_;
  auVar9._14_2_ = VVar10.field_0._6_2_;
  auVar8._12_4_ = auVar9._12_4_;
  auVar8._8_2_ = 0;
  auVar8._0_8_ = uVar4;
  auVar8._10_2_ = VVar10.field_0._4_2_;
  auVar7._10_6_ = auVar8._10_6_;
  auVar7._8_2_ = VVar10.field_0._4_2_;
  auVar7._0_8_ = uVar4;
  auVar6._8_8_ = auVar7._8_8_;
  auVar6._6_2_ = VVar10.field_0._2_2_;
  auVar6._4_2_ = VVar10.field_0._2_2_;
  auVar6._0_2_ = VVar10.field_0._0_2_;
  auVar6._2_2_ = auVar6._0_2_;
  auVar1._8_4_ = 0;
  auVar1._0_8_ = VVar11.field_0.i64_;
  auVar1._12_2_ = VVar11.field_0._6_2_;
  auVar2._8_2_ = VVar11.field_0._4_2_;
  auVar2._0_8_ = VVar11.field_0.i64_;
  auVar2._10_4_ = auVar1._10_4_;
  auVar3._6_8_ = 0;
  auVar3._0_6_ = auVar2._8_6_;
  auVar5._6_8_ = SUB148(auVar3 << 0x40,6);
  auVar5._4_2_ = VVar11.field_0._2_2_;
  auVar5._0_2_ = VVar11.field_0._0_2_;
  auVar5._2_2_ = 0;
  auVar5._14_2_ = 0;
  VVar10.field_0 = (anon_union_16_6_113bff37_for_Value_0)pmaddwd(auVar5,auVar6);
  Push(this,VVar10);
  return Ok;
}

Assistant:

RunResult Thread::DoSimdExtmul() {
  auto rhs = Pop<T>();
  auto lhs = Pop<T>();
  S result;
  using U = typename S::LaneType;
  for (u8 i = 0; i < S::lanes; ++i) {
    u8 laneidx = (low ? 0 : S::lanes) + i;
    result[i] = U(lhs[laneidx]) * U(rhs[laneidx]);
  }
  Push(result);
  return RunResult::Ok;
}